

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O2

UInt32 Bt4_MatchFinder_GetMatches(CMatchFinder *p,UInt32 *distances)

{
  uint lenLimit;
  CLzRef CVar1;
  CLzRef CVar2;
  CLzRef CVar3;
  UInt32 _cyclicBufferSize;
  byte *cur;
  CLzRef *pCVar4;
  bool bVar5;
  uint uVar6;
  UInt32 UVar7;
  byte *pbVar8;
  UInt32 *pUVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  UInt32 maxLen;
  ulong uVar14;
  uint uVar15;
  
  lenLimit = p->lenLimit;
  if ((ulong)lenLimit < 4) {
    MatchFinder_MovePos(p);
    return 0;
  }
  cur = p->buffer;
  uVar10 = (uint)cur[1] ^ p->crc[*cur];
  uVar6 = (uint)cur[2] << 8 ^ uVar10;
  uVar10 = uVar10 & 0x3ff;
  uVar12 = (ulong)(uVar6 & 0xffff);
  pCVar4 = p->hash;
  CVar1 = p->pos;
  CVar2 = pCVar4[uVar10];
  uVar15 = CVar1 - CVar2;
  CVar3 = pCVar4[uVar12 + 0x400];
  uVar6 = ((p->crc[cur[3]] << 5 ^ uVar6) & p->hashMask) + 0x10400;
  UVar7 = pCVar4[uVar6];
  pCVar4[uVar10] = CVar1;
  pCVar4[uVar12 + 0x400] = CVar1;
  pCVar4[uVar6] = CVar1;
  uVar6 = 0;
  bVar5 = true;
  uVar12 = (ulong)uVar15;
  if ((uVar15 < p->cyclicBufferSize) && (cur[-uVar12] == *cur)) {
    *distances = 2;
    distances[1] = uVar15 - 1;
    uVar6 = 2;
    bVar5 = false;
  }
  if (((CVar3 == CVar2) || (uVar10 = CVar1 - CVar3, p->cyclicBufferSize <= uVar10)) ||
     (cur[-(ulong)uVar10] != *cur)) {
    if (!bVar5) {
      uVar14 = (ulong)uVar6;
      goto LAB_00111288;
    }
    _cyclicBufferSize = p->cyclicBufferSize;
    uVar6 = 0;
    uVar10 = 0;
  }
  else {
    distances[(ulong)uVar6 + 1] = uVar10 - 1;
    uVar6 = uVar6 + 2;
    uVar14 = 3;
    uVar12 = (ulong)uVar10;
LAB_00111288:
    pbVar8 = cur + uVar14;
    iVar11 = (int)cur + lenLimit;
    for (lVar13 = lenLimit - uVar14; lVar13 != 0; lVar13 = lVar13 + -1) {
      if (pbVar8[-uVar12] != *pbVar8) {
        iVar11 = (int)pbVar8;
        break;
      }
      pbVar8 = pbVar8 + 1;
    }
    uVar10 = iVar11 - (int)cur;
    distances[uVar6 - 2] = uVar10;
    _cyclicBufferSize = p->cyclicBufferSize;
    if (lenLimit == uVar10) {
      SkipMatchesSpec(lenLimit,UVar7,p->pos,cur,p->son,p->cyclicBufferPos,_cyclicBufferSize,
                      p->cutValue);
      goto LAB_00111316;
    }
  }
  maxLen = 3;
  if (3 < uVar10) {
    maxLen = uVar10;
  }
  pUVar9 = GetMatchesSpec1(lenLimit,UVar7,p->pos,cur,p->son,p->cyclicBufferPos,_cyclicBufferSize,
                           p->cutValue,distances + uVar6,maxLen);
  uVar6 = (uint)((ulong)((long)pUVar9 - (long)distances) >> 2);
LAB_00111316:
  p->cyclicBufferPos = p->cyclicBufferPos + 1;
  p->buffer = p->buffer + 1;
  UVar7 = p->pos + 1;
  p->pos = UVar7;
  if (UVar7 == p->posLimit) {
    MatchFinder_CheckLimits(p);
  }
  return uVar6;
}

Assistant:

static UInt32 Bt4_MatchFinder_GetMatches(CMatchFinder *p, UInt32 *distances)
{
  UInt32 h2, h3, d2, d3, maxLen, offset, pos;
  UInt32 *hash;
  GET_MATCHES_HEADER(4)

  HASH4_CALC;

  hash = p->hash;
  pos = p->pos;

  d2 = pos - hash[                h2];
  d3 = pos - hash[kFix3HashSize + h3];

  curMatch = hash[kFix4HashSize + hv];

  hash[                h2] = pos;
  hash[kFix3HashSize + h3] = pos;
  hash[kFix4HashSize + hv] = pos;

  maxLen = 0;
  offset = 0;
  
  if (d2 < p->cyclicBufferSize && *(cur - d2) == *cur)
  {
    distances[0] = maxLen = 2;
    distances[1] = d2 - 1;
    offset = 2;
  }
  
  if (d2 != d3 && d3 < p->cyclicBufferSize && *(cur - d3) == *cur)
  {
    maxLen = 3;
    distances[offset + 1] = d3 - 1;
    offset += 2;
    d2 = d3;
  }
  
  if (offset != 0)
  {
    UPDATE_maxLen
    distances[offset - 2] = maxLen;
    if (maxLen == lenLimit)
    {
      SkipMatchesSpec(lenLimit, curMatch, MF_PARAMS(p));
      MOVE_POS_RET;
    }
  }
  
  if (maxLen < 3)
    maxLen = 3;
  
  GET_MATCHES_FOOTER(offset, maxLen)
}